

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

Message * __thiscall
google::protobuf::anon_unknown_1::GeneratedMessageFactory::GetPrototype
          (GeneratedMessageFactory *this,Descriptor *type)

{
  Mutex *this_00;
  hash_map<const_google::protobuf::Descriptor_*,_const_google::protobuf::Message_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::Message_*>_>_>
  *collection;
  DescriptorPool *pDVar1;
  second_type pMVar2;
  DescriptorPool *pDVar3;
  iterator iVar4;
  LogMessage *pLVar5;
  code *pcVar6;
  LogFinisher local_61;
  Descriptor *local_60;
  LogMessage local_58;
  
  this_00 = &this->mutex_;
  local_60 = type;
  internal::Mutex::Lock(this_00);
  collection = &this->type_map_;
  pMVar2 = FindPtrOrNull<google::protobuf::hash_map<google::protobuf::Descriptor_const*,google::protobuf::Message_const*,google::protobuf::hash<google::protobuf::Descriptor_const*>,std::equal_to<google::protobuf::Descriptor_const*>,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::Message_const*>>>>
                     (collection,&local_60);
  internal::Mutex::Unlock(this_00);
  if (pMVar2 == (second_type)0x0) {
    pDVar1 = *(DescriptorPool **)(*(long *)(local_60 + 0x10) + 0x10);
    pDVar3 = DescriptorPool::generated_pool();
    if (pDVar1 == pDVar3) {
      local_58._0_8_ = *(undefined8 *)**(undefined8 **)(local_60 + 0x10);
      iVar4 = std::
              _Hashtable<const_char_*,_std::pair<const_char_*const,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::pair<const_char_*const,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<const_char_*,_std::pair<const_char_*const,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::pair<const_char_*const,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&this->file_map_,(key_type *)&local_58);
      if (iVar4.
          super__Node_iterator_base<std::pair<const_char_*const,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
          ._M_cur == (__node_type *)0x0) {
        pcVar6 = (code *)0x0;
      }
      else {
        pcVar6 = *(code **)((long)iVar4.
                                  super__Node_iterator_base<std::pair<const_char_*const,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
                                  ._M_cur + 0x10);
      }
      if (pcVar6 != (code *)0x0) {
        internal::Mutex::Lock(this_00);
        pMVar2 = FindPtrOrNull<google::protobuf::hash_map<google::protobuf::Descriptor_const*,google::protobuf::Message_const*,google::protobuf::hash<google::protobuf::Descriptor_const*>,std::equal_to<google::protobuf::Descriptor_const*>,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::Message_const*>>>>
                           (collection,&local_60);
        if (pMVar2 == (second_type)0x0) {
          (*pcVar6)(**(undefined8 **)(local_60 + 0x10));
          pMVar2 = FindPtrOrNull<google::protobuf::hash_map<google::protobuf::Descriptor_const*,google::protobuf::Message_const*,google::protobuf::hash<google::protobuf::Descriptor_const*>,std::equal_to<google::protobuf::Descriptor_const*>,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::Message_const*>>>>
                             (collection,&local_60);
        }
        if (pMVar2 == (second_type)0x0) {
          internal::LogMessage::LogMessage
                    (&local_58,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/message.cc"
                     ,0x15f);
          pLVar5 = internal::LogMessage::operator<<
                             (&local_58,"Type appears to be in generated pool but wasn\'t ");
          pLVar5 = internal::LogMessage::operator<<(pLVar5,"registered: ");
          pLVar5 = internal::LogMessage::operator<<(pLVar5,*(string **)(local_60 + 8));
          internal::LogFinisher::operator=(&local_61,pLVar5);
          internal::LogMessage::~LogMessage(&local_58);
        }
        internal::Mutex::Unlock(this_00);
        return pMVar2;
      }
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/message.cc"
                 ,0x14e);
      pLVar5 = internal::LogMessage::operator<<
                         (&local_58,"File appears to be in generated pool but wasn\'t registered: ")
      ;
      pLVar5 = internal::LogMessage::operator<<(pLVar5,(string *)**(undefined8 **)(local_60 + 0x10))
      ;
      internal::LogFinisher::operator=(&local_61,pLVar5);
      internal::LogMessage::~LogMessage(&local_58);
    }
    pMVar2 = (second_type)0x0;
  }
  return pMVar2;
}

Assistant:

const Message* GeneratedMessageFactory::GetPrototype(const Descriptor* type) {
  {
    ReaderMutexLock lock(&mutex_);
    const Message* result = FindPtrOrNull(type_map_, type);
    if (result != NULL) return result;
  }

  // If the type is not in the generated pool, then we can't possibly handle
  // it.
  if (type->file()->pool() != DescriptorPool::generated_pool()) return NULL;

  // Apparently the file hasn't been registered yet.  Let's do that now.
  RegistrationFunc* registration_func =
      FindPtrOrNull(file_map_, type->file()->name().c_str());
  if (registration_func == NULL) {
    GOOGLE_LOG(DFATAL) << "File appears to be in generated pool but wasn't "
                   "registered: " << type->file()->name();
    return NULL;
  }

  WriterMutexLock lock(&mutex_);

  // Check if another thread preempted us.
  const Message* result = FindPtrOrNull(type_map_, type);
  if (result == NULL) {
    // Nope.  OK, register everything.
    registration_func(type->file()->name());
    // Should be here now.
    result = FindPtrOrNull(type_map_, type);
  }

  if (result == NULL) {
    GOOGLE_LOG(DFATAL) << "Type appears to be in generated pool but wasn't "
                << "registered: " << type->full_name();
  }

  return result;
}